

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall
gl4cts::GPUShaderFP64Test2::uniformTypeDetails::uniformTypeDetails
          (uniformTypeDetails *this,GLuint n_columns,GLuint n_rows)

{
  _variable_type type;
  GLenum GVar1;
  string local_48;
  
  this->m_n_columns = n_columns;
  this->m_n_rows = n_rows;
  (this->m_type_name)._M_dataplus._M_p = (pointer)&(this->m_type_name).field_2;
  (this->m_type_name)._M_string_length = 0;
  (this->m_type_name).field_2._M_local_buf[0] = '\0';
  type = Utils::getDoubleVariableType::types[n_columns - 1][n_rows - VARIABLE_TYPE_BVEC2];
  Utils::getVariableTypeString_abi_cxx11_
            (&local_48,(Utils *)(ulong)type,n_rows - VARIABLE_TYPE_BVEC2);
  std::__cxx11::string::operator=((string *)&this->m_type_name,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  GVar1 = Utils::getGLDataTypeOfVariableType(type);
  this->m_type = GVar1;
  return;
}

Assistant:

GPUShaderFP64Test2::uniformTypeDetails::uniformTypeDetails(glw::GLuint n_columns, glw::GLuint n_rows)
	: m_n_columns(n_columns), m_n_rows(n_rows)
{
	Utils::_variable_type type = Utils::getDoubleVariableType(n_columns, n_rows);

	m_type_name = Utils::getVariableTypeString(type);
	m_type		= Utils::getGLDataTypeOfVariableType(type);
}